

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

char * ImGui::GetNavInputName(ImGuiNavInput n)

{
  ImGuiNavInput n_local;
  
  return GetNavInputName::names[n];
}

Assistant:

const char* ImGui::GetNavInputName(ImGuiNavInput n)
{
    static const char* names[] =
    {
        "Activate", "Cancel", "Input", "Menu", "DpadLeft", "DpadRight", "DpadUp", "DpadDown", "LStickLeft", "LStickRight", "LStickUp", "LStickDown",
        "FocusPrev", "FocusNext", "TweakSlow", "TweakFast", "KeyLeft", "KeyRight", "KeyUp", "KeyDown"
    };
    IM_ASSERT(IM_ARRAYSIZE(names) == ImGuiNavInput_COUNT);
    IM_ASSERT(n >= 0 && n < ImGuiNavInput_COUNT);
    return names[n];
}